

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_error(UnixSftpServer *uss,SftpReplyBuilder *reply)

{
  int *piVar1;
  char *msg;
  undefined4 local_1c;
  uint code;
  SftpReplyBuilder *reply_local;
  UnixSftpServer *uss_local;
  
  local_1c = 4;
  piVar1 = __errno_location();
  if (*piVar1 == 1) {
    local_1c = 3;
  }
  else if (*piVar1 == 2) {
    local_1c = 2;
  }
  piVar1 = __errno_location();
  msg = strerror(*piVar1);
  fxp_reply_error(reply,local_1c,msg);
  return;
}

Assistant:

static void uss_error(UnixSftpServer *uss, SftpReplyBuilder *reply)
{
    unsigned code = SSH_FX_FAILURE;
    switch (errno) {
      case ENOENT:
        code = SSH_FX_NO_SUCH_FILE;
        break;
      case EPERM:
        code = SSH_FX_PERMISSION_DENIED;
        break;
    }
    fxp_reply_error(reply, code, strerror(errno));
}